

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::anon_unknown_0::
AssignDescriptorsHelper<google::protobuf::internal::MigrationSchema>::AssignMessageDescriptor
          (AssignDescriptorsHelper<google::protobuf::internal::MigrationSchema> *this,
          Descriptor *descriptor)

{
  int iVar1;
  MigrationSchema *pMVar2;
  uint32 *puVar3;
  GeneratedMessageReflection *this_00;
  DescriptorPool *pool;
  int *piVar4;
  long lVar5;
  long lVar6;
  ReflectionSchema result;
  ReflectionSchema local_50;
  
  if (0 < *(int *)(descriptor + 0x48)) {
    lVar6 = 0;
    lVar5 = 0;
    do {
      AssignMessageDescriptor(this,(Descriptor *)(*(long *)(descriptor + 0x50) + lVar6));
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0xa8;
    } while (lVar5 < *(int *)(descriptor + 0x48));
  }
  this->file_level_metadata_->descriptor = descriptor;
  if (*(char *)(*(long *)(descriptor + 0x20) + 0x6b) == '\0') {
    this_00 = (GeneratedMessageReflection *)operator_new(0x58);
    pMVar2 = this->schemas_;
    puVar3 = this->offsets_;
    lVar5._0_4_ = pMVar2->offsets_index;
    lVar5._4_4_ = pMVar2->has_bit_indices_index;
    local_50.object_size_ = pMVar2->object_size;
    local_50.default_instance_ = *this->default_instance_data_;
    lVar6 = lVar5 << 0x20;
    piVar4 = (int *)((lVar6 >> 0x1e) + (long)puVar3);
    local_50.offsets_ = (uint32 *)(piVar4 + 5);
    local_50.has_bit_indices_ = puVar3 + (lVar5 >> 0x20);
    local_50.has_bits_offset_ = *piVar4;
    local_50.metadata_offset_ = *(int *)((long)puVar3 + (lVar6 + 0x100000000 >> 0x1e));
    local_50.extensions_offset_ = *(int *)((long)puVar3 + (lVar6 + 0x200000000 >> 0x1e));
    local_50.oneof_case_offset_ = *(int *)((long)puVar3 + (lVar6 + 0x300000000 >> 0x1e));
    local_50.weak_field_map_offset_ = *(int *)((long)puVar3 + (lVar6 + 0x400000000 >> 0x1e));
    pool = DescriptorPool::generated_pool();
    GeneratedMessageReflection::GeneratedMessageReflection
              (this_00,descriptor,&local_50,pool,this->factory_);
    this->file_level_metadata_->reflection = (Reflection *)this_00;
    iVar1 = *(int *)(descriptor + 0x58);
    if (0 < (long)iVar1) {
      lVar5 = 0;
      do {
        *this->file_level_enum_descriptors_ =
             (EnumDescriptor *)(*(long *)(descriptor + 0x60) + lVar5);
        this->file_level_enum_descriptors_ = this->file_level_enum_descriptors_ + 1;
        lVar5 = lVar5 + 0x38;
      } while ((long)iVar1 * 0x38 - lVar5 != 0);
    }
    this->schemas_ = this->schemas_ + 1;
  }
  this->default_instance_data_ = this->default_instance_data_ + 1;
  this->file_level_metadata_ = this->file_level_metadata_ + 1;
  return;
}

Assistant:

void AssignMessageDescriptor(const Descriptor* descriptor) {
    for (int i = 0; i < descriptor->nested_type_count(); i++) {
      AssignMessageDescriptor(descriptor->nested_type(i));
    }

    file_level_metadata_->descriptor = descriptor;

    if (!descriptor->options().map_entry()) {
      // Only set reflection for non map types.
      file_level_metadata_->reflection = new GeneratedMessageReflection(
          descriptor, MigrationToReflectionSchema(default_instance_data_,
                                                  offsets_, *schemas_),
          ::google::protobuf::DescriptorPool::generated_pool(), factory_);
      for (int i = 0; i < descriptor->enum_type_count(); i++) {
        AssignEnumDescriptor(descriptor->enum_type(i));
      }
      schemas_++;
    }
    default_instance_data_++;
    file_level_metadata_++;
  }